

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndsWithMatch.cpp
# Opt level: O0

void __thiscall oout::EndsWithMatch::EndsWithMatch(EndsWithMatch *this,string *text)

{
  string *text_local;
  EndsWithMatch *this_local;
  
  Match::Match(&this->super_Match);
  (this->super_Match)._vptr_Match = (_func_int **)&PTR__EndsWithMatch_003253a0;
  std::__cxx11::string::string((string *)&this->text,(string *)text);
  return;
}

Assistant:

EndsWithMatch::EndsWithMatch(const string &text)
	: text(text)
{
}